

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

_Bool ggml_are_same_layout(ggml_tensor *a,ggml_tensor *b)

{
  int i;
  ggml_tensor *b_local;
  ggml_tensor *a_local;
  _Bool local_1;
  
  if (a->type == b->type) {
    for (i = 0; i < 4; i = i + 1) {
      if (a->ne[i] != b->ne[i]) {
        return false;
      }
      if (a->nb[i] != b->nb[i]) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ggml_are_same_layout(const struct ggml_tensor * a, const struct ggml_tensor * b) {
    if (a->type != b->type) {
        return false;
    }
    for (int i = 0; i < GGML_MAX_DIMS; i++) {
        if (a->ne[i] != b->ne[i]) {
            return false;
        }
        if (a->nb[i] != b->nb[i]) {
            return false;
        }
    }
    return true;
}